

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O0

uchar * __thiscall Http2::Frame::hpackBlockBegin(Frame *this)

{
  FrameType FVar1;
  uchar *puVar2;
  uchar *begin;
  FrameType frameType;
  Frame *in_stack_ffffffffffffffd8;
  Frame *in_stack_ffffffffffffffe8;
  
  FVar1 = type(in_stack_ffffffffffffffd8);
  puVar2 = dataBegin(in_stack_ffffffffffffffe8);
  if (FVar1 == PUSH_PROMISE) {
    puVar2 = puVar2 + 4;
  }
  return puVar2;
}

Assistant:

const uchar *Frame::hpackBlockBegin() const
{
    Q_ASSERT(validatePayload() == FrameStatus::goodFrame);

    const auto frameType = type();
    Q_ASSERT(frameType == FrameType::HEADERS ||
             frameType == FrameType::PUSH_PROMISE ||
             frameType == FrameType::CONTINUATION);

    const uchar *begin = dataBegin();
    if (frameType == FrameType::PUSH_PROMISE)
        begin += 4; // That's a promised stream, skip it.
    return begin;
}